

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int flattenSubquery(Parse *pParse,Select *p,int iFrom,int isAgg)

{
  SrcList **ppSVar1;
  u8 *puVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  sqlite3 *db;
  SrcList *pSVar9;
  char *pcVar10;
  SrcList *pSVar11;
  ExprList *pEVar12;
  Select *pSVar13;
  Table *pTVar14;
  bool bVar15;
  int iVar16;
  int *aCsrMap;
  Select *pSVar17;
  Select *pSVar18;
  Expr *pEVar19;
  u32 uVar20;
  long lVar21;
  anon_union_4_2_6146edf4_for_u *paVar22;
  byte bVar23;
  undefined8 *puVar24;
  long lVar25;
  Parse *pParse_00;
  undefined8 *puVar26;
  ulong uVar27;
  undefined4 uVar28;
  SrcItem *pSrcItem;
  byte bVar29;
  Walker w;
  Select *local_d8;
  SrcList *local_d0;
  Walker local_68;
  
  bVar29 = 0;
  db = pParse->db;
  if ((db->dbOptFlags & 1) != 0) {
    return 0;
  }
  if (p->pWin != (Window *)0x0) {
    return 0;
  }
  pSVar9 = p->pSrc;
  pSVar18 = pSVar9->a[iFrom].pSelect;
  if (pSVar18->pWin != (Window *)0x0) {
    return 0;
  }
  pcVar10 = pParse->zAuthContext;
  iVar6 = pSVar9->a[iFrom].iCursor;
  pSVar11 = pSVar18->pSrc;
  pEVar19 = pSVar18->pLimit;
  if (pEVar19 != (Expr *)0x0) {
    if (p->pLimit != (Expr *)0x0) {
      return 0;
    }
    if ((pEVar19 != (Expr *)0x0) && (pEVar19->pRight != (Expr *)0x0)) {
      return 0;
    }
  }
  uVar7 = p->selFlags;
  if ((pEVar19 != (Expr *)0x0 & (byte)(uVar7 >> 8) & 1) != 0) {
    return 0;
  }
  iVar16 = pSVar11->nSrc;
  if (iVar16 == 0) {
    return 0;
  }
  uVar8 = pSVar18->selFlags;
  if ((uVar8 & 1) != 0) {
    return 0;
  }
  if (pEVar19 != (Expr *)0x0) {
    if (isAgg != 0) {
      return 0;
    }
    if (1 < pSVar9->nSrc) {
      return 0;
    }
  }
  pEVar12 = p->pOrderBy;
  if ((pEVar12 != (ExprList *)0x0) && (pSVar18->pOrderBy != (ExprList *)0x0)) {
    return 0;
  }
  if ((isAgg != 0) && (pSVar18->pOrderBy != (ExprList *)0x0)) {
    return 0;
  }
  if (pEVar19 == (Expr *)0x0) {
    if ((uVar8 >> 0xd & 1) != 0) {
      return 0;
    }
  }
  else {
    if (p->pWhere != (Expr *)0x0) {
      return 0;
    }
    if ((uVar7 & 1) != 0 && pEVar19 != (Expr *)0x0 || (uVar8 >> 0xd & 1) != 0) {
      return 0;
    }
  }
  bVar3 = pSVar9->a[iFrom].fg.jointype;
  if ((bVar3 & 0x60) == 0) {
    uVar28 = 0;
  }
  else {
    if (isAgg != 0) {
      return 0;
    }
    if (1 < iVar16) {
      return 0;
    }
    if ((pSVar11->a[0].pTab)->eTabType == '\x01') {
      return 0;
    }
    if ((bVar3 & 0x10) != 0 || (uVar7 & 1) != 0) {
      return 0;
    }
    uVar28 = 1;
  }
  if (((0 < iFrom) && ((pSVar11->a[0].fg.jointype & 0x40) != 0)) ||
     ((uVar5 = *(ushort *)&pSVar9->a[iFrom].fg.field_0x1, (uVar5 >> 8 & 1) != 0 &&
      ((pSVar9->a[iFrom].u2.pCteUse)->eM10d == '\0')))) {
    return 0;
  }
  if ((1 < iVar16) && ((pSVar11->a[iVar16 - 1].fg.jointype & 0x20) != 0)) {
    if ((bVar3 & 4) != 0) {
      return 0;
    }
    if ((uVar5 & 0x400) != 0) {
      return 0;
    }
    if ((uVar5 >> 0xb & 1) != 0) {
      return 0;
    }
    if (pSVar9->a[iFrom].u3.pOn != (Expr *)0x0) {
      return 0;
    }
  }
  aCsrMap = (int *)0x0;
  if (pSVar18->pPrior != (Select *)0x0) {
    if (isAgg != 0) {
      return 0;
    }
    if (pSVar18->pOrderBy != (ExprList *)0x0) {
      return 0;
    }
    pSVar13 = pSVar18;
    if ((uVar7 & 1) != 0 || (bVar3 & 0x60) != 0) {
      return 0;
    }
    while (pSVar13 != (Select *)0x0) {
      if ((pSVar13->selFlags & 9) != 0) {
        return 0;
      }
      pSVar17 = pSVar13->pPrior;
      if ((pSVar17 != (Select *)0x0) && (pSVar13->op != 0x87)) {
        return 0;
      }
      ppSVar1 = &pSVar13->pSrc;
      if ((*ppSVar1)->nSrc < 1) {
        return 0;
      }
      if (pSVar13->pWin != (Window *)0x0) {
        return 0;
      }
      pSVar13 = pSVar17;
      if ((0 < iFrom) && (((*ppSVar1)->a[0].fg.jointype & 0x40) != 0)) {
        return 0;
      }
    }
    if ((pEVar12 != (ExprList *)0x0) && (0 < (long)pEVar12->nExpr)) {
      lVar25 = 0;
      do {
        if (*(short *)((long)&pEVar12->a[0].u + lVar25) == 0) {
          return 0;
        }
        lVar25 = lVar25 + 0x18;
      } while ((long)pEVar12->nExpr * 0x18 != lVar25);
    }
    if ((uVar7 >> 0xd & 1) != 0) {
      return 0;
    }
    aCsrMap = (int *)0x0;
    if (1 < pSVar9->nSrc) {
      if ((db->dbOptFlags >> 0x17 & 1) != 0) {
        return 0;
      }
      if (500 < pParse->nSelect) {
        return 0;
      }
      aCsrMap = (int *)sqlite3DbMallocZero(db,(long)pParse->nTab * 4 + 4);
      if (aCsrMap == (int *)0x0) {
        aCsrMap = (int *)0x0;
      }
      else {
        *aCsrMap = pParse->nTab;
      }
    }
  }
  pParse->zAuthContext = pSVar9->a[iFrom].zName;
  sqlite3AuthCheck(pParse,0x15,(char *)0x0,(char *)0x0,(char *)0x0);
  pParse->zAuthContext = pcVar10;
  pcVar10 = pSVar9->a[iFrom].zDatabase;
  pSVar13 = pSVar9->a[iFrom].pSelect;
  if (pcVar10 != (char *)0x0) {
    sqlite3DbFreeNN(db,pcVar10);
  }
  pcVar10 = pSVar9->a[iFrom].zName;
  if (pcVar10 != (char *)0x0) {
    sqlite3DbFreeNN(db,pcVar10);
  }
  pcVar10 = pSVar9->a[iFrom].zAlias;
  if (pcVar10 != (char *)0x0) {
    sqlite3DbFreeNN(db,pcVar10);
  }
  pSVar9->a[iFrom].pSelect = (Select *)0x0;
  pSVar9->a[iFrom].zAlias = (char *)0x0;
  pSVar9->a[iFrom].zDatabase = (char *)0x0;
  pSVar9->a[iFrom].zName = (char *)0x0;
  local_d8 = pSVar18->pPrior;
  if (local_d8 != (Select *)0x0) {
    do {
      pEVar19 = p->pLimit;
      pEVar12 = p->pOrderBy;
      pSVar18 = p->pPrior;
      pTVar14 = pSVar9->a[iFrom].pTab;
      pSVar9->a[iFrom].pTab = (Table *)0x0;
      p->pLimit = (Expr *)0x0;
      p->pOrderBy = (ExprList *)0x0;
      p->pPrior = (Select *)0x0;
      pSVar17 = sqlite3SelectDup(db,p,0);
      p->pLimit = pEVar19;
      p->pOrderBy = pEVar12;
      p->op = 0x87;
      pSVar9->a[iFrom].pTab = pTVar14;
      if (pSVar17 != (Select *)0x0) {
        uVar20 = pParse->nSelect + 1;
        pParse->nSelect = uVar20;
        pSVar17->selId = uVar20;
        if ((aCsrMap != (int *)0x0) && (db->mallocFailed == '\0')) {
          renumberCursors(pParse,pSVar17,iFrom,aCsrMap);
        }
        pSVar17->pPrior = pSVar18;
        if (pSVar18 != (Select *)0x0) {
          pSVar18->pNext = pSVar17;
        }
        pSVar17->pNext = p;
        pSVar18 = pSVar17;
      }
      p->pPrior = pSVar18;
      local_d8 = local_d8->pPrior;
    } while (local_d8 != (Select *)0x0);
  }
  if (aCsrMap != (int *)0x0) {
    sqlite3DbFreeNN(db,aCsrMap);
  }
  if (db->mallocFailed == '\0') {
    pTVar14 = pSVar9->a[iFrom].pTab;
    if (pTVar14 != (Table *)0x0) {
      if (pTVar14->nTabRef == 1) {
        pParse_00 = pParse->pToplevel;
        if (pParse->pToplevel == (Parse *)0x0) {
          pParse_00 = pParse;
        }
        sqlite3ParserAddCleanup(pParse_00,sqlite3DeleteTable,pTVar14);
      }
      else {
        pTVar14->nTabRef = pTVar14->nTabRef - 1;
      }
      pSVar9->a[iFrom].pTab = (Table *)0x0;
    }
    if (p != (Select *)0x0) {
      iVar16 = -1;
      pSVar17 = pSVar13;
      pSVar18 = p;
      local_d0 = pSVar9;
      do {
        if (pSVar18 == p) {
          bVar23 = pSVar9->a[iFrom].fg.jointype;
        }
        else {
          bVar23 = 0;
        }
        bVar4 = local_d0->a[iFrom].fg.jointype;
        pSVar11 = pSVar17->pSrc;
        uVar7 = pSVar11->nSrc;
        uVar27 = (ulong)uVar7;
        local_d0 = pSVar18->pSrc;
        if ((int)uVar7 < 2) {
LAB_0017637c:
          if (0 < (int)uVar7) {
            lVar25 = 0;
            do {
              if (((&local_d0->a[iFrom].fg.field_0x2)[lVar25] & 4) != 0) {
                sqlite3IdListDelete(db,*(IdList **)((long)&local_d0->a[iFrom].u3 + lVar25));
              }
              puVar24 = (undefined8 *)((long)&pSVar11->a[0].pSchema + lVar25);
              puVar26 = (undefined8 *)((long)&local_d0->a[iFrom].pSchema + lVar25);
              for (lVar21 = 0xd; lVar21 != 0; lVar21 = lVar21 + -1) {
                *puVar26 = *puVar24;
                puVar24 = puVar24 + (ulong)bVar29 * -2 + 1;
                puVar26 = puVar26 + (ulong)bVar29 * -2 + 1;
              }
              puVar2 = &local_d0->a[iFrom].fg.jointype + lVar25;
              *puVar2 = *puVar2 | bVar4 & 0x40;
              iVar16 = *(int *)((long)&pSVar11->a[0].iCursor + lVar25);
              puVar24 = (undefined8 *)((long)&pSVar11->a[0].pSchema + lVar25);
              *puVar24 = 0;
              puVar24[1] = 0;
              puVar24 = (undefined8 *)((long)&pSVar11->a[0].zName + lVar25);
              *puVar24 = 0;
              puVar24[1] = 0;
              puVar24 = (undefined8 *)((long)&pSVar11->a[0].pTab + lVar25);
              *puVar24 = 0;
              puVar24[1] = 0;
              puVar24 = (undefined8 *)((long)&pSVar11->a[0].addrFillSub + lVar25);
              *puVar24 = 0;
              puVar24[1] = 0;
              puVar24 = (undefined8 *)((long)&pSVar11->a[0].colUsed + lVar25);
              *puVar24 = 0;
              puVar24[1] = 0;
              puVar24 = (undefined8 *)((long)&pSVar11->a[0].iCursor + lVar25);
              *puVar24 = 0;
              puVar24[1] = 0;
              *(undefined8 *)((long)&pSVar11->a[0].u2 + lVar25) = 0;
              lVar25 = lVar25 + 0x68;
            } while (uVar27 * 0x68 != lVar25);
          }
          local_d0->a[iFrom].fg.jointype =
               bVar23 | bVar4 & 0x40 | local_d0->a[iFrom].fg.jointype & 0x40;
          pEVar12 = pSVar17->pOrderBy;
          if ((pEVar12 != (ExprList *)0x0) && ((pSVar18->selFlags & 0x400000) == 0)) {
            if (0 < pEVar12->nExpr) {
              paVar22 = &pEVar12->a[0].u;
              lVar25 = 0;
              do {
                (paVar22->x).iOrderByCol = 0;
                lVar25 = lVar25 + 1;
                paVar22 = paVar22 + 6;
              } while (lVar25 < pEVar12->nExpr);
            }
            pSVar18->pOrderBy = pEVar12;
            pSVar17->pOrderBy = (ExprList *)0x0;
          }
          pEVar19 = pSVar17->pWhere;
          pSVar17->pWhere = (Expr *)0x0;
          if ((bVar3 & 0x60) != 0) {
            sqlite3SetJoinExpr(pEVar19,iVar16,1);
          }
          if (pEVar19 != (Expr *)0x0) {
            if (pSVar18->pWhere != (Expr *)0x0) {
              pEVar19 = sqlite3PExpr(pParse,0x2c,pEVar19,pSVar18->pWhere);
            }
            pSVar18->pWhere = pEVar19;
          }
          if (db->mallocFailed == '\0') {
            local_68.xExprCallback = (_func_int_Walker_ptr_Expr_ptr *)CONCAT44(iVar16,iVar6);
            local_68.xSelectCallback =
                 (_func_int_Walker_ptr_Select_ptr *)CONCAT44(local_68.xSelectCallback._4_4_,uVar28);
            local_68.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)pSVar17->pEList;
            local_68.pParse = pParse;
            substSelect((SubstContext *)&local_68,pSVar18,0);
          }
          pSVar18->selFlags = pSVar18->selFlags | pSVar17->selFlags & 0x100;
          if (pSVar17->pLimit != (Expr *)0x0) {
            pSVar18->pLimit = pSVar17->pLimit;
            pSVar17->pLimit = (Expr *)0x0;
          }
          if (0 < (int)uVar7) {
            pSrcItem = local_d0->a + iFrom;
            do {
              recomputeColumnsUsed(pSVar18,pSrcItem);
              pSrcItem = pSrcItem + 1;
              uVar27 = uVar27 - 1;
            } while (uVar27 != 0);
          }
          bVar15 = true;
        }
        else {
          local_d0 = sqlite3SrcListEnlarge(pParse,local_d0,uVar7 - 1,iFrom + 1);
          if (local_d0 != (SrcList *)0x0) {
            pSVar18->pSrc = local_d0;
            goto LAB_0017637c;
          }
          bVar15 = false;
          local_d0 = (SrcList *)0x0;
        }
        if (!bVar15) break;
        pSVar18 = pSVar18->pPrior;
        pSVar17 = pSVar17->pPrior;
      } while (pSVar18 != (Select *)0x0);
    }
    local_68.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
    local_68.walkerDepth = 0;
    local_68.eCode = 0;
    local_68._38_2_ = 0;
    local_68.u.pNC = (NameContext *)0x0;
    local_68.xExprCallback = agginfoPersistExprCb;
    local_68.xSelectCallback = sqlite3SelectWalkNoop;
    local_68.pParse = pParse;
    sqlite3WalkSelect(&local_68,pSVar13);
    if (pSVar13 != (Select *)0x0) {
      clearSelect(db,pSVar13,1);
      return 1;
    }
  }
  else {
    pSVar9->a[iFrom].pSelect = pSVar13;
  }
  return 1;
}

Assistant:

static int flattenSubquery(
  Parse *pParse,       /* Parsing context */
  Select *p,           /* The parent or outer SELECT statement */
  int iFrom,           /* Index in p->pSrc->a[] of the inner subquery */
  int isAgg            /* True if outer SELECT uses aggregate functions */
){
  const char *zSavedAuthContext = pParse->zAuthContext;
  Select *pParent;    /* Current UNION ALL term of the other query */
  Select *pSub;       /* The inner query or "subquery" */
  Select *pSub1;      /* Pointer to the rightmost select in sub-query */
  SrcList *pSrc;      /* The FROM clause of the outer query */
  SrcList *pSubSrc;   /* The FROM clause of the subquery */
  int iParent;        /* VDBE cursor number of the pSub result set temp table */
  int iNewParent = -1;/* Replacement table for iParent */
  int isOuterJoin = 0; /* True if pSub is the right side of a LEFT JOIN */
  int i;              /* Loop counter */
  Expr *pWhere;                    /* The WHERE clause */
  SrcItem *pSubitem;               /* The subquery */
  sqlite3 *db = pParse->db;
  Walker w;                        /* Walker to persist agginfo data */
  int *aCsrMap = 0;

  /* Check to see if flattening is permitted.  Return 0 if not.
  */
  assert( p!=0 );
  assert( p->pPrior==0 );
  if( OptimizationDisabled(db, SQLITE_QueryFlattener) ) return 0;
  pSrc = p->pSrc;
  assert( pSrc && iFrom>=0 && iFrom<pSrc->nSrc );
  pSubitem = &pSrc->a[iFrom];
  iParent = pSubitem->iCursor;
  pSub = pSubitem->pSelect;
  assert( pSub!=0 );

#ifndef SQLITE_OMIT_WINDOWFUNC
  if( p->pWin || pSub->pWin ) return 0;                  /* Restriction (25) */
#endif

  pSubSrc = pSub->pSrc;
  assert( pSubSrc );
  /* Prior to version 3.1.2, when LIMIT and OFFSET had to be simple constants,
  ** not arbitrary expressions, we allowed some combining of LIMIT and OFFSET
  ** because they could be computed at compile-time.  But when LIMIT and OFFSET
  ** became arbitrary expressions, we were forced to add restrictions (13)
  ** and (14). */
  if( pSub->pLimit && p->pLimit ) return 0;              /* Restriction (13) */
  if( pSub->pLimit && pSub->pLimit->pRight ) return 0;   /* Restriction (14) */
  if( (p->selFlags & SF_Compound)!=0 && pSub->pLimit ){
    return 0;                                            /* Restriction (15) */
  }
  if( pSubSrc->nSrc==0 ) return 0;                       /* Restriction (7)  */
  if( pSub->selFlags & SF_Distinct ) return 0;           /* Restriction (4)  */
  if( pSub->pLimit && (pSrc->nSrc>1 || isAgg) ){
     return 0;         /* Restrictions (8)(9) */
  }
  if( p->pOrderBy && pSub->pOrderBy ){
     return 0;                                           /* Restriction (11) */
  }
  if( isAgg && pSub->pOrderBy ) return 0;                /* Restriction (16) */
  if( pSub->pLimit && p->pWhere ) return 0;              /* Restriction (19) */
  if( pSub->pLimit && (p->selFlags & SF_Distinct)!=0 ){
     return 0;         /* Restriction (21) */
  }
  if( pSub->selFlags & (SF_Recursive) ){
    return 0; /* Restrictions (22) */
  }

  /*
  ** If the subquery is the right operand of a LEFT JOIN, then the
  ** subquery may not be a join itself (3a). Example of why this is not
  ** allowed:
  **
  **         t1 LEFT OUTER JOIN (t2 JOIN t3)
  **
  ** If we flatten the above, we would get
  **
  **         (t1 LEFT OUTER JOIN t2) JOIN t3
  **
  ** which is not at all the same thing.
  **
  ** If the subquery is the right operand of a LEFT JOIN, then the outer
  ** query cannot be an aggregate. (3c)  This is an artifact of the way
  ** aggregates are processed - there is no mechanism to determine if
  ** the LEFT JOIN table should be all-NULL.
  **
  ** See also tickets #306, #350, and #3300.
  */
  if( (pSubitem->fg.jointype & (JT_OUTER|JT_LTORJ))!=0 ){
    if( pSubSrc->nSrc>1                        /* (3a) */
     || isAgg                                  /* (3c) */
     || IsVirtual(pSubSrc->a[0].pTab)          /* (3b) */
     || (p->selFlags & SF_Distinct)!=0         /* (3d) */
     || (pSubitem->fg.jointype & JT_RIGHT)!=0  /* (26) */
    ){
      return 0;
    }
    isOuterJoin = 1;
  }
#ifdef SQLITE_EXTRA_IFNULLROW
  else if( iFrom>0 && !isAgg ){
    /* Setting isOuterJoin to -1 causes OP_IfNullRow opcodes to be generated for
    ** every reference to any result column from subquery in a join, even
    ** though they are not necessary.  This will stress-test the OP_IfNullRow
    ** opcode. */
    isOuterJoin = -1;
  }
#endif

  assert( pSubSrc->nSrc>0 );  /* True by restriction (7) */
  if( iFrom>0 && (pSubSrc->a[0].fg.jointype & JT_LTORJ)!=0 ){
    return 0;   /* Restriction (27a) */
  }
  if( pSubitem->fg.isCte && pSubitem->u2.pCteUse->eM10d==M10d_Yes ){
    return 0;       /* (28) */
  }

  /* Restriction (29):
  **
  ** We do not want two constraints on the same term of the flattened
  ** query where one constraint has EP_InnerON and the other is EP_OuterON.
  ** To prevent this, one or the other of the following conditions must be
  ** false:
  **
  **   (29a)  The right-most entry in the FROM clause of the subquery
  **          must not be part of an outer join.
  **
  **   (29b)  The subquery itself must not be the right operand of a
  **          NATURAL join or a join that as an ON or USING clause.
  **
  ** These conditions are sufficient to keep an EP_OuterON from being
  ** flattened into an EP_InnerON.  Restrictions (3a) and (27a) prevent
  ** an EP_InnerON from being flattened into an EP_OuterON.
  */
  if( pSubSrc->nSrc>=2
   && (pSubSrc->a[pSubSrc->nSrc-1].fg.jointype & JT_OUTER)!=0
  ){
    if( (pSubitem->fg.jointype & JT_NATURAL)!=0
     || pSubitem->fg.isUsing
     || NEVER(pSubitem->u3.pOn!=0) /* ON clause already shifted into WHERE */
     || pSubitem->fg.isOn
    ){
      return 0;
    }
  }

  /* Restriction (17): If the sub-query is a compound SELECT, then it must
  ** use only the UNION ALL operator. And none of the simple select queries
  ** that make up the compound SELECT are allowed to be aggregate or distinct
  ** queries.
  */
  if( pSub->pPrior ){
    if( pSub->pOrderBy ){
      return 0;  /* Restriction (20) */
    }
    if( isAgg || (p->selFlags & SF_Distinct)!=0 || isOuterJoin>0 ){
      return 0; /* (17d1), (17d2), or (17f) */
    }
    for(pSub1=pSub; pSub1; pSub1=pSub1->pPrior){
      testcase( (pSub1->selFlags & (SF_Distinct|SF_Aggregate))==SF_Distinct );
      testcase( (pSub1->selFlags & (SF_Distinct|SF_Aggregate))==SF_Aggregate );
      assert( pSub->pSrc!=0 );
      assert( (pSub->selFlags & SF_Recursive)==0 );
      assert( pSub->pEList->nExpr==pSub1->pEList->nExpr );
      if( (pSub1->selFlags & (SF_Distinct|SF_Aggregate))!=0    /* (17b) */
       || (pSub1->pPrior && pSub1->op!=TK_ALL)                 /* (17a) */
       || pSub1->pSrc->nSrc<1                                  /* (17c) */
#ifndef SQLITE_OMIT_WINDOWFUNC
       || pSub1->pWin                                          /* (17e) */
#endif
      ){
        return 0;
      }
      if( iFrom>0 && (pSub1->pSrc->a[0].fg.jointype & JT_LTORJ)!=0 ){
        /* Without this restriction, the JT_LTORJ flag would end up being
        ** omitted on left-hand tables of the right join that is being
        ** flattened. */
        return 0;   /* Restrictions (17g), (27b) */
      }
      testcase( pSub1->pSrc->nSrc>1 );
    }

    /* Restriction (18). */
    if( p->pOrderBy ){
      int ii;
      for(ii=0; ii<p->pOrderBy->nExpr; ii++){
        if( p->pOrderBy->a[ii].u.x.iOrderByCol==0 ) return 0;
      }
    }

    /* Restriction (23) */
    if( (p->selFlags & SF_Recursive) ) return 0;

    if( pSrc->nSrc>1 ){
      if( pParse->nSelect>500 ) return 0;
      if( OptimizationDisabled(db, SQLITE_FlttnUnionAll) ) return 0;
      aCsrMap = sqlite3DbMallocZero(db, ((i64)pParse->nTab+1)*sizeof(int));
      if( aCsrMap ) aCsrMap[0] = pParse->nTab;
    }
  }

  /***** If we reach this point, flattening is permitted. *****/
  SELECTTRACE(1,pParse,p,("flatten %u.%p from term %d\n",
                   pSub->selId, pSub, iFrom));

  /* Authorize the subquery */
  pParse->zAuthContext = pSubitem->zName;
  TESTONLY(i =) sqlite3AuthCheck(pParse, SQLITE_SELECT, 0, 0, 0);
  testcase( i==SQLITE_DENY );
  pParse->zAuthContext = zSavedAuthContext;

  /* Delete the transient structures associated with thesubquery */
  pSub1 = pSubitem->pSelect;
  sqlite3DbFree(db, pSubitem->zDatabase);
  sqlite3DbFree(db, pSubitem->zName);
  sqlite3DbFree(db, pSubitem->zAlias);
  pSubitem->zDatabase = 0;
  pSubitem->zName = 0;
  pSubitem->zAlias = 0;
  pSubitem->pSelect = 0;
  assert( pSubitem->fg.isUsing!=0 || pSubitem->u3.pOn==0 );

  /* If the sub-query is a compound SELECT statement, then (by restrictions
  ** 17 and 18 above) it must be a UNION ALL and the parent query must
  ** be of the form:
  **
  **     SELECT <expr-list> FROM (<sub-query>) <where-clause>
  **
  ** followed by any ORDER BY, LIMIT and/or OFFSET clauses. This block
  ** creates N-1 copies of the parent query without any ORDER BY, LIMIT or
  ** OFFSET clauses and joins them to the left-hand-side of the original
  ** using UNION ALL operators. In this case N is the number of simple
  ** select statements in the compound sub-query.
  **
  ** Example:
  **
  **     SELECT a+1 FROM (
  **        SELECT x FROM tab
  **        UNION ALL
  **        SELECT y FROM tab
  **        UNION ALL
  **        SELECT abs(z*2) FROM tab2
  **     ) WHERE a!=5 ORDER BY 1
  **
  ** Transformed into:
  **
  **     SELECT x+1 FROM tab WHERE x+1!=5
  **     UNION ALL
  **     SELECT y+1 FROM tab WHERE y+1!=5
  **     UNION ALL
  **     SELECT abs(z*2)+1 FROM tab2 WHERE abs(z*2)+1!=5
  **     ORDER BY 1
  **
  ** We call this the "compound-subquery flattening".
  */
  for(pSub=pSub->pPrior; pSub; pSub=pSub->pPrior){
    Select *pNew;
    ExprList *pOrderBy = p->pOrderBy;
    Expr *pLimit = p->pLimit;
    Select *pPrior = p->pPrior;
    Table *pItemTab = pSubitem->pTab;
    pSubitem->pTab = 0;
    p->pOrderBy = 0;
    p->pPrior = 0;
    p->pLimit = 0;
    pNew = sqlite3SelectDup(db, p, 0);
    p->pLimit = pLimit;
    p->pOrderBy = pOrderBy;
    p->op = TK_ALL;
    pSubitem->pTab = pItemTab;
    if( pNew==0 ){
      p->pPrior = pPrior;
    }else{
      pNew->selId = ++pParse->nSelect;
      if( aCsrMap && ALWAYS(db->mallocFailed==0) ){
        renumberCursors(pParse, pNew, iFrom, aCsrMap);
      }
      pNew->pPrior = pPrior;
      if( pPrior ) pPrior->pNext = pNew;
      pNew->pNext = p;
      p->pPrior = pNew;
      SELECTTRACE(2,pParse,p,("compound-subquery flattener"
                              " creates %u as peer\n",pNew->selId));
    }
    assert( pSubitem->pSelect==0 );
  }
  sqlite3DbFree(db, aCsrMap);
  if( db->mallocFailed ){
    pSubitem->pSelect = pSub1;
    return 1;
  }

  /* Defer deleting the Table object associated with the
  ** subquery until code generation is
  ** complete, since there may still exist Expr.pTab entries that
  ** refer to the subquery even after flattening.  Ticket #3346.
  **
  ** pSubitem->pTab is always non-NULL by test restrictions and tests above.
  */
  if( ALWAYS(pSubitem->pTab!=0) ){
    Table *pTabToDel = pSubitem->pTab;
    if( pTabToDel->nTabRef==1 ){
      Parse *pToplevel = sqlite3ParseToplevel(pParse);
      sqlite3ParserAddCleanup(pToplevel,
         (void(*)(sqlite3*,void*))sqlite3DeleteTable,
         pTabToDel);
      testcase( pToplevel->earlyCleanup );
    }else{
      pTabToDel->nTabRef--;
    }
    pSubitem->pTab = 0;
  }

  /* The following loop runs once for each term in a compound-subquery
  ** flattening (as described above).  If we are doing a different kind
  ** of flattening - a flattening other than a compound-subquery flattening -
  ** then this loop only runs once.
  **
  ** This loop moves all of the FROM elements of the subquery into the
  ** the FROM clause of the outer query.  Before doing this, remember
  ** the cursor number for the original outer query FROM element in
  ** iParent.  The iParent cursor will never be used.  Subsequent code
  ** will scan expressions looking for iParent references and replace
  ** those references with expressions that resolve to the subquery FROM
  ** elements we are now copying in.
  */
  pSub = pSub1;
  for(pParent=p; pParent; pParent=pParent->pPrior, pSub=pSub->pPrior){
    int nSubSrc;
    u8 jointype = 0;
    u8 ltorj = pSrc->a[iFrom].fg.jointype & JT_LTORJ;
    assert( pSub!=0 );
    pSubSrc = pSub->pSrc;     /* FROM clause of subquery */
    nSubSrc = pSubSrc->nSrc;  /* Number of terms in subquery FROM clause */
    pSrc = pParent->pSrc;     /* FROM clause of the outer query */

    if( pParent==p ){
      jointype = pSubitem->fg.jointype;     /* First time through the loop */
    }

    /* The subquery uses a single slot of the FROM clause of the outer
    ** query.  If the subquery has more than one element in its FROM clause,
    ** then expand the outer query to make space for it to hold all elements
    ** of the subquery.
    **
    ** Example:
    **
    **    SELECT * FROM tabA, (SELECT * FROM sub1, sub2), tabB;
    **
    ** The outer query has 3 slots in its FROM clause.  One slot of the
    ** outer query (the middle slot) is used by the subquery.  The next
    ** block of code will expand the outer query FROM clause to 4 slots.
    ** The middle slot is expanded to two slots in order to make space
    ** for the two elements in the FROM clause of the subquery.
    */
    if( nSubSrc>1 ){
      pSrc = sqlite3SrcListEnlarge(pParse, pSrc, nSubSrc-1,iFrom+1);
      if( pSrc==0 ) break;
      pParent->pSrc = pSrc;
    }

    /* Transfer the FROM clause terms from the subquery into the
    ** outer query.
    */
    for(i=0; i<nSubSrc; i++){
      SrcItem *pItem = &pSrc->a[i+iFrom];
      if( pItem->fg.isUsing ) sqlite3IdListDelete(db, pItem->u3.pUsing);
      assert( pItem->fg.isTabFunc==0 );
      *pItem = pSubSrc->a[i];
      pItem->fg.jointype |= ltorj;
      iNewParent = pSubSrc->a[i].iCursor;
      memset(&pSubSrc->a[i], 0, sizeof(pSubSrc->a[i]));
    }
    pSrc->a[iFrom].fg.jointype &= JT_LTORJ;
    pSrc->a[iFrom].fg.jointype |= jointype | ltorj;

    /* Now begin substituting subquery result set expressions for
    ** references to the iParent in the outer query.
    **
    ** Example:
    **
    **   SELECT a+5, b*10 FROM (SELECT x*3 AS a, y+10 AS b FROM t1) WHERE a>b;
    **   \                     \_____________ subquery __________/          /
    **    \_____________________ outer query ______________________________/
    **
    ** We look at every expression in the outer query and every place we see
    ** "a" we substitute "x*3" and every place we see "b" we substitute "y+10".
    */
    if( pSub->pOrderBy && (pParent->selFlags & SF_NoopOrderBy)==0 ){
      /* At this point, any non-zero iOrderByCol values indicate that the
      ** ORDER BY column expression is identical to the iOrderByCol'th
      ** expression returned by SELECT statement pSub. Since these values
      ** do not necessarily correspond to columns in SELECT statement pParent,
      ** zero them before transfering the ORDER BY clause.
      **
      ** Not doing this may cause an error if a subsequent call to this
      ** function attempts to flatten a compound sub-query into pParent
      ** (the only way this can happen is if the compound sub-query is
      ** currently part of pSub->pSrc). See ticket [d11a6e908f].  */
      ExprList *pOrderBy = pSub->pOrderBy;
      for(i=0; i<pOrderBy->nExpr; i++){
        pOrderBy->a[i].u.x.iOrderByCol = 0;
      }
      assert( pParent->pOrderBy==0 );
      pParent->pOrderBy = pOrderBy;
      pSub->pOrderBy = 0;
    }
    pWhere = pSub->pWhere;
    pSub->pWhere = 0;
    if( isOuterJoin>0 ){
      sqlite3SetJoinExpr(pWhere, iNewParent, EP_OuterON);
    }
    if( pWhere ){
      if( pParent->pWhere ){
        pParent->pWhere = sqlite3PExpr(pParse, TK_AND, pWhere, pParent->pWhere);
      }else{
        pParent->pWhere = pWhere;
      }
    }
    if( db->mallocFailed==0 ){
      SubstContext x;
      x.pParse = pParse;
      x.iTable = iParent;
      x.iNewTable = iNewParent;
      x.isOuterJoin = isOuterJoin;
      x.pEList = pSub->pEList;
      substSelect(&x, pParent, 0);
    }

    /* The flattened query is a compound if either the inner or the
    ** outer query is a compound. */
    pParent->selFlags |= pSub->selFlags & SF_Compound;
    assert( (pSub->selFlags & SF_Distinct)==0 ); /* restriction (17b) */

    /*
    ** SELECT ... FROM (SELECT ... LIMIT a OFFSET b) LIMIT x OFFSET y;
    **
    ** One is tempted to try to add a and b to combine the limits.  But this
    ** does not work if either limit is negative.
    */
    if( pSub->pLimit ){
      pParent->pLimit = pSub->pLimit;
      pSub->pLimit = 0;
    }

    /* Recompute the SrcList_item.colUsed masks for the flattened
    ** tables. */
    for(i=0; i<nSubSrc; i++){
      recomputeColumnsUsed(pParent, &pSrc->a[i+iFrom]);
    }
  }

  /* Finially, delete what is left of the subquery and return
  ** success.
  */
  sqlite3AggInfoPersistWalkerInit(&w, pParse);
  sqlite3WalkSelect(&w,pSub1);
  sqlite3SelectDelete(db, pSub1);

#if TREETRACE_ENABLED
  if( sqlite3TreeTrace & 0x100 ){
    SELECTTRACE(0x100,pParse,p,("After flattening:\n"));
    sqlite3TreeViewSelect(0, p, 0);
  }
#endif

  return 1;
}